

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManCutRange(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  void *pvVar1;
  Vec_Ptr_t *p_00;
  int iVar2;
  
  Aig_ManIncrementTravId(p);
  for (iVar2 = 0; iVar2 < vLower->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vLower,iVar2);
    *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
  }
  p_00 = Vec_PtrAlloc(100);
  for (iVar2 = 0; iVar2 < vUpper->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vUpper,iVar2);
    if (*(int *)((long)pvVar1 + 0x20) != p->nTravIds) {
      Vec_PtrPush(p_00,pvVar1);
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb_ManCutRange( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vRange;
    Aig_Obj_t * pObj;
    int i;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // collect the upper ones that are not marked
    vRange = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vRange, pObj );
    return vRange;
}